

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool ShouldIndent(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  Bool BVar2;
  bool local_25;
  Node *pNStack_20;
  TidyTriState indentContent;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  iVar1 = (int)(doc->config).value[0x25].v;
  if (iVar1 == 0) {
    doc_local._4_4_ = no;
  }
  else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
          (node->tag->id != TidyTag_TEXTAREA)) {
    if (iVar1 == 2) {
      if ((node->content != (Node *)0x0) && (BVar2 = prvTidynodeHasCM(node,0x40000), BVar2 != no)) {
        pNStack_20 = node->content;
        while( true ) {
          if (pNStack_20 == (Node *)0x0) {
            return no;
          }
          BVar2 = prvTidynodeHasCM(pNStack_20,8);
          if (BVar2 != no) break;
          pNStack_20 = pNStack_20->next;
        }
        return yes;
      }
      BVar2 = prvTidynodeHasCM(node,0x4000);
      if (BVar2 != no) {
        return no;
      }
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_HTML))
      {
        return no;
      }
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_P)) {
        return no;
      }
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TITLE))
      {
        return no;
      }
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
         ((node->tag->id == TidyTag_DIV &&
          ((((node->last != (Node *)0x0 && (node->last != (Node *)0x0)) &&
            (node->last->tag != (Dict *)0x0)) && (node->last->tag->id == TidyTag_IMG)))))) {
        return no;
      }
    }
    BVar2 = prvTidynodeHasCM(node,0xc00);
    if (BVar2 == no) {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_MAP)) {
        BVar2 = prvTidynodeHasCM(node,0x10);
        local_25 = false;
        if (BVar2 == no) {
          local_25 = node->content != (Node *)0x0;
        }
        doc_local._4_4_ = (Bool)local_25;
      }
      else {
        doc_local._4_4_ = yes;
      }
    }
    else {
      doc_local._4_4_ = yes;
    }
  }
  else {
    doc_local._4_4_ = no;
  }
  return doc_local._4_4_;
}

Assistant:

static Bool ShouldIndent( TidyDocImpl* doc, Node *node )
{
    TidyTriState indentContent = cfgAutoBool( doc, TidyIndentContent );
    if ( indentContent == TidyNoState )
        return no;

    if ( nodeIsTEXTAREA(node) )
        return no;

    if ( indentContent == TidyAutoState )
    {
        if ( node->content && TY_(nodeHasCM)(node, CM_NO_INDENT) )
        {
            for ( node = node->content; node; node = node->next )
                if ( TY_(nodeHasCM)(node, CM_BLOCK) )
                    return yes;
            return no;
        }

        if ( TY_(nodeHasCM)(node, CM_HEADING) )
            return no;

        if ( nodeIsHTML(node) )
            return no;

        if ( nodeIsP(node) )
            return no;

        if ( nodeIsTITLE(node) )
            return no;

        /* http://tidy.sf.net/issue/1610888
           Indenting <div><img /></div> produces spurious lines with IE 6.x */
        if ( nodeIsDIV(node) && node->last && nodeIsIMG(node->last) )
            return no;
    }

    if ( TY_(nodeHasCM)(node, CM_FIELD | CM_OBJECT) )
        return yes;

    if ( nodeIsMAP(node) )
        return yes;

    return ( !TY_(nodeHasCM)( node, CM_INLINE ) && node->content );
}